

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void selection_do_grow(opvar *ov,int dir)

{
  char cVar1;
  char local_6b8 [8];
  char tmp [80] [21];
  int local_20;
  int local_1c;
  int c;
  int y;
  int x;
  int dir_local;
  opvar *ov_local;
  
  if ((ov->spovartyp == '\t') && (ov != (opvar *)0x0)) {
    memset(local_6b8,0,0x690);
    for (c = 0; c < 0x50; c = c + 1) {
      for (local_1c = 0; local_1c < 0x15; local_1c = local_1c + 1) {
        local_20 = 0;
        if ((((dir & 8U) != 0) && (0 < c)) &&
           (cVar1 = selection_getpoint(c + -1,local_1c,ov), cVar1 != '\0')) {
          local_20 = 1;
        }
        if ((((dir & 9U) != 0) && (0 < c)) &&
           ((0 < local_1c && (cVar1 = selection_getpoint(c + -1,local_1c + -1,ov), cVar1 != '\0'))))
        {
          local_20 = local_20 + 1;
        }
        if ((((dir & 1U) != 0) && (0 < local_1c)) &&
           (cVar1 = selection_getpoint(c,local_1c + -1,ov), cVar1 != '\0')) {
          local_20 = local_20 + 1;
        }
        if (((((dir & 5U) != 0) && (0 < local_1c)) && (c < 0x4f)) &&
           (cVar1 = selection_getpoint(c + 1,local_1c + -1,ov), cVar1 != '\0')) {
          local_20 = local_20 + 1;
        }
        if ((((dir & 4U) != 0) && (c < 0x4f)) &&
           (cVar1 = selection_getpoint(c + 1,local_1c,ov), cVar1 != '\0')) {
          local_20 = local_20 + 1;
        }
        if ((((dir & 6U) != 0) && (c < 0x4f)) &&
           ((local_1c < 0x14 && (cVar1 = selection_getpoint(c + 1,local_1c + 1,ov), cVar1 != '\0')))
           ) {
          local_20 = local_20 + 1;
        }
        if ((((dir & 2U) != 0) && (local_1c < 0x14)) &&
           (cVar1 = selection_getpoint(c,local_1c + 1,ov), cVar1 != '\0')) {
          local_20 = local_20 + 1;
        }
        if ((((dir & 10U) != 0) && (local_1c < 0x14)) &&
           ((0 < c && (cVar1 = selection_getpoint(c + -1,local_1c + 1,ov), cVar1 != '\0')))) {
          local_20 = local_20 + 1;
        }
        if (local_20 != 0) {
          tmp[(long)c + -1][(long)local_1c + 0xd] = '\x01';
        }
      }
    }
    for (c = 0; c < 0x50; c = c + 1) {
      for (local_1c = 0; local_1c < 0x15; local_1c = local_1c + 1) {
        if (tmp[(long)c + -1][(long)local_1c + 0xd] != '\0') {
          selection_setpoint(c,local_1c,ov,'\x01');
        }
      }
    }
  }
  return;
}

Assistant:

static void selection_do_grow(struct opvar *ov, int dir)
{
	int x, y, c;
	char tmp[COLNO][ROWNO];

	if (ov->spovartyp != SPOVAR_SEL) return;
	if (!ov) return;

	memset(tmp, 0, sizeof(tmp));

	for (x = 0; x < COLNO; x++) {
	    for (y = 0; y < ROWNO; y++) {
		c = 0;
		if ((dir & W_WEST) && x > 0 &&
		    selection_getpoint(x-1, y, ov)) c++;
		if ((dir & (W_WEST|W_NORTH)) && x > 0 && y > 0 &&
		    selection_getpoint(x-1, y-1, ov)) c++;
		if ((dir & W_NORTH) && y > 0 &&
		    selection_getpoint(x, y-1, ov)) c++;
		if ((dir & (W_NORTH|W_EAST)) && y > 0 && x < COLNO-1 &&
		    selection_getpoint(x+1, y-1, ov)) c++;
		if ((dir & W_EAST) && x < COLNO-1 &&
		    selection_getpoint(x+1, y, ov)) c++;
		if ((dir & (W_EAST|W_SOUTH)) && x < COLNO-1 && y < ROWNO-1 &&
		    selection_getpoint(x+1, y+1, ov)) c++;
		if ((dir & W_SOUTH) && y < ROWNO-1 &&
		    selection_getpoint(x, y+1, ov)) c++;
		if ((dir & (W_SOUTH|W_WEST)) && y < ROWNO-1 && x > 0 &&
		    selection_getpoint(x-1, y+1, ov)) c++;
		if (c) tmp[x][y] = 1;
	    }
	}

	for (x = 0; x < COLNO; x++)
	    for (y = 0; y < ROWNO; y++)
		if (tmp[x][y])
		    selection_setpoint(x, y, ov, 1);
}